

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

int hydro_compare(uint8_t *b1_,uint8_t *b2_,size_t len)

{
  byte bVar1;
  byte bVar2;
  uint8_t *b1;
  
  bVar1 = 1;
  bVar2 = 0;
  while (len != 0) {
    bVar2 = (byte)((uint)b2_[len - 1] - (uint)b1_[len - 1] >> 8) & bVar1 | bVar2;
    bVar1 = (byte)((b1_[len - 1] ^ b2_[len - 1]) + 0x7fff >> 8) & bVar1;
    len = len - 1;
  }
  return (bVar1 - 1) + (uint)bVar2 * 2;
}

Assistant:

int
hydro_compare(const uint8_t *b1_, const uint8_t *b2_, size_t len)
{
    const volatile uint8_t *volatile b1 = (const volatile uint8_t *volatile) b1_;
    const uint8_t *b2                   = (const uint8_t *) b2_;
    uint8_t        gt                   = 0U;
    uint8_t        eq                   = 1U;
    size_t         i;

    i = len;
    while (i != 0U) {
        i--;
        gt |= ((b2[i] - b1[i]) >> 8) & eq;
        eq &= ((b2[i] ^ b1[i]) - 1) >> 8;
    }
    return (int) (gt + gt + eq) - 1;
}